

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# difference_iterator.hpp
# Opt level: O0

void __thiscall
burst::
difference_iterator<std::_List_const_iterator<char>,_std::_List_const_iterator<char>,_std::greater<void>_>
::maintain_invariant
          (difference_iterator<std::_List_const_iterator<char>,_std::_List_const_iterator<char>,_std::greater<void>_>
           *this)

{
  bool bVar1;
  reference pcVar2;
  reference pcVar3;
  byte local_19;
  difference_iterator<std::_List_const_iterator<char>,_std::_List_const_iterator<char>,_std::greater<void>_>
  *this_local;
  
  while( true ) {
    bVar1 = std::operator!=(&this->m_subtrahend_begin,&this->m_subtrahend_end);
    local_19 = 0;
    if (bVar1) {
      bVar1 = std::operator!=(&this->m_minuend_begin,&this->m_minuend_end);
      local_19 = 0;
      if (bVar1) {
        pcVar2 = std::_List_const_iterator<char>::operator*(&this->m_minuend_begin);
        pcVar3 = std::_List_const_iterator<char>::operator*(&this->m_subtrahend_begin);
        bVar1 = std::greater<void>::operator()((greater<void> *)&this->field_0x20,pcVar2,pcVar3);
        local_19 = bVar1 ^ 0xff;
      }
    }
    if ((local_19 & 1) == 0) break;
    pcVar2 = std::_List_const_iterator<char>::operator*(&this->m_subtrahend_begin);
    pcVar3 = std::_List_const_iterator<char>::operator*(&this->m_minuend_begin);
    bVar1 = std::greater<void>::operator()((greater<void> *)&this->field_0x20,pcVar2,pcVar3);
    if (!bVar1) {
      std::_List_const_iterator<char>::operator++(&this->m_minuend_begin);
      std::_List_const_iterator<char>::operator++(&this->m_subtrahend_begin);
    }
    drop_subtrahend_head(this);
  }
  return;
}

Assistant:

void maintain_invariant ()
        {
            while (m_subtrahend_begin != m_subtrahend_end
                && m_minuend_begin != m_minuend_end
                && not m_compare(*m_minuend_begin, *m_subtrahend_begin))
            {
                if (not m_compare(*m_subtrahend_begin, *m_minuend_begin))
                {
                    ++m_minuend_begin;
                    ++m_subtrahend_begin;
                }
                drop_subtrahend_head();
            }
        }